

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::
ValidationErrorTest_ExtensionDeclarationsMismatchFullName_Test::
ValidationErrorTest_ExtensionDeclarationsMismatchFullName_Test
          (ValidationErrorTest_ExtensionDeclarationsMismatchFullName_Test *this)

{
  ValidationErrorTest_ExtensionDeclarationsMismatchFullName_Test *this_local;
  
  ValidationErrorTest::ValidationErrorTest(&this->super_ValidationErrorTest);
  (this->super_ValidationErrorTest).super_Test._vptr_Test =
       (_func_int **)&PTR__ValidationErrorTest_ExtensionDeclarationsMismatchFullName_Test_029aeb80;
  return;
}

Assistant:

TEST_F(ValidationErrorTest, ExtensionDeclarationsMismatchFullName) {
  BuildFileWithErrors(
      R"pb(
        name: "foo.proto"
        package: "ext.test"
        message_type {
          name: "Foo"
          extension_range {
            start: 11
            end: 999
            options: {
              declaration: {
                number: 100
                full_name: ".ext.test.buz"
                type: ".ext.test.Bar"
              }
            }
          }
        }
        message_type { name: "Bar" }
        extension { extendee: "Foo" name: "foo" number: 100 type_name: "Bar" }
      )pb",
      "foo.proto: ext.test.foo: EXTENDEE: \"ext.test.Foo\" extension field 100"
      " is expected to have field name \".ext.test.buz\", not "
      "\".ext.test.foo\".\n");
}